

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapQuaternion.cpp
# Opt level: O0

bool mnf::ExpMapQuaternion::isInM_(VectorXd *val,double prec)

{
  Scalar SVar1;
  Index IVar2;
  Scalar *data;
  bool local_69;
  ConstReverseQuaternion local_48;
  double norm;
  double dStack_18;
  bool out;
  double prec_local;
  VectorXd *val_local;
  
  dStack_18 = prec;
  prec_local = (double)val;
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)val);
  norm._7_1_ = IVar2 == 4;
  data = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                   ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)prec_local);
  utils::ConstReverseQuaternion::ConstReverseQuaternion(&local_48,data);
  SVar1 = Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::norm
                    ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_48);
  utils::ConstReverseQuaternion::~ConstReverseQuaternion(&local_48);
  local_69 = (norm._7_1_ & 1) != 0 && ABS(SVar1 - 1.0) < dStack_18;
  return local_69;
}

Assistant:

bool ExpMapQuaternion::isInM_(const Eigen::VectorXd& val, double prec)
{
  bool out(val.size() == 4);
  double norm = toConstQuat(val.data()).norm();
  out = out && (fabs(norm - 1) < prec);
  return out;
}